

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall capnp::SchemaLoader::SchemaLoader(SchemaLoader *this)

{
  Own<capnp::SchemaLoader::Impl> local_20;
  
  kj::heap<capnp::SchemaLoader::Impl,capnp::SchemaLoader&>((kj *)&local_20,this);
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>>::
  MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>>
            ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>> *)this,&local_20);
  if (local_20.ptr != (Impl *)0x0) {
    local_20.ptr = (Impl *)0x0;
    (**(local_20.disposer)->_vptr_Disposer)();
  }
  return;
}

Assistant:

SchemaLoader::SchemaLoader(): impl(kj::heap<Impl>(*this)) {}